

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

int __thiscall deqp::egl::ResizeTests::init(ResizeTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ResizeTests *local_10;
  ResizeTests *this_local;
  
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"surface_size",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EGL surface size update",&local_69);
  pTVar3 = createCaseGroup<deqp::egl::ChangeSurfaceSizeCase>(pEVar1,&local_30,&local_68);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"back_buffer",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Back buffer contents",&local_b9);
  pTVar3 = createCaseGroup<deqp::egl::PreserveBackBufferCase>(pEVar1,&local_90,&local_b8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"pixel_density",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Pixel density",&local_109);
  pTVar3 = createCaseGroup<deqp::egl::UpdateResolutionCase>(pEVar1,&local_e0,&local_108);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  iVar2 = std::allocator<char>::~allocator(&local_e1);
  return iVar2;
}

Assistant:

void ResizeTests::init (void)
{
	addChild(createCaseGroup<ChangeSurfaceSizeCase>(m_eglTestCtx,
													"surface_size",
													"EGL surface size update"));
	addChild(createCaseGroup<PreserveBackBufferCase>(m_eglTestCtx,
													 "back_buffer",
													 "Back buffer contents"));
	addChild(createCaseGroup<UpdateResolutionCase>(m_eglTestCtx,
												   "pixel_density",
												   "Pixel density"));
}